

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReaderTests.cpp
# Opt level: O2

int testStorageReaderTestsRawData(void)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  uchar *puVar4;
  uint uVar5;
  initializer_list<unsigned_char> __l;
  initializer_list<MILBlob::Fp16> __l_00;
  initializer_list<unsigned_int> __l_01;
  Span<const_unsigned_char,_18446744073709551615UL> SVar6;
  allocator_type local_89;
  StorageReader reader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expectedValues;
  undefined8 local_68;
  undefined8 uStack_60;
  string local_50;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::MakeStorageTempFileWith3Records();
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  std::__cxx11::string::string((string *)&local_50,(string *)psVar2);
  MILBlob::Blob::StorageReader::StorageReader(&reader,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  SVar6 = MILBlob::Blob::StorageReader::GetRawDataView(&reader,0x40);
  if (SVar6.m_size.m_size.m_size == 5) {
    local_68 = CONCAT35(local_68._5_3_,0x700400002);
    __l._M_len = 5;
    __l._M_array = (iterator)&local_68;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&expectedValues,__l,&local_89);
    puVar4 = (uchar *)0x0;
    if ((long)expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      puVar4 = expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    bVar1 = std::__equal4<unsigned_char_const*,unsigned_char*>
                      (SVar6.m_ptr,SVar6.m_ptr + 5,puVar4,
                       puVar4 + ((long)expectedValues.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)expectedValues.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start));
    if (bVar1) {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      SVar6 = MILBlob::Blob::StorageReader::GetRawDataView(&reader,0xc0);
      if (SVar6.m_size.m_size.m_size == 8) {
        local_68 = 0x810c0fe000e;
        __l_00._M_len = 4;
        __l_00._M_array = (iterator)&local_68;
        std::vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>::vector
                  ((vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> *)&expectedValues,__l_00,
                   (allocator_type *)&local_89);
        puVar4 = (uchar *)0x0;
        if ((long)expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          puVar4 = expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        }
        bVar1 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                          (SVar6.m_ptr,SVar6.m_ptr + 8,puVar4,
                           puVar4 + ((long)expectedValues.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)expectedValues.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
        if (bVar1) {
          std::_Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>::~_Vector_base
                    ((_Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> *)&expectedValues)
          ;
          SVar6 = MILBlob::Blob::StorageReader::GetRawDataView(&reader,0x140);
          if (SVar6.m_size.m_size.m_size == 0x10) {
            local_68 = 0xc0fee00700000;
            uStack_60 = 0x91fade0008face;
            __l_01._M_len = 4;
            __l_01._M_array = (iterator)&local_68;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&expectedValues,__l_01
                       ,(allocator_type *)&local_89);
            puVar4 = (uchar *)0x0;
            if ((long)expectedValues.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)expectedValues.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != 0) {
              puVar4 = expectedValues.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            }
            bVar1 = std::__equal4<unsigned_char_const*,unsigned_char*>
                              (SVar6.m_ptr,SVar6.m_ptr + 0x10,puVar4,
                               puVar4 + ((long)expectedValues.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)expectedValues.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start));
            if (!bVar1) {
              poVar3 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                                      );
              poVar3 = std::operator<<(poVar3,":");
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x11b);
              poVar3 = std::operator<<(poVar3,": error: ");
              poVar3 = std::operator<<(poVar3,
                                       "std::equal(data.begin(), data.end(), Util::SpanCast<uint8_t>(Util::MakeSpan(expectedValues)).begin(), Util::SpanCast<uint8_t>(Util::MakeSpan(expectedValues)).end())"
                                      );
              poVar3 = std::operator<<(poVar3," was false, expected true.");
              std::endl<char,std::char_traits<char>>(poVar3);
            }
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&expectedValues)
            ;
            uVar5 = (uint)!bVar1;
            goto LAB_0017a63c;
          }
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x118);
          poVar3 = std::operator<<(poVar3,": error: ");
          poVar3 = std::operator<<(poVar3,"(data.Size()) == (size_t(16))");
          poVar3 = std::operator<<(poVar3," was false, expected true.");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x113);
          poVar3 = std::operator<<(poVar3,": error: ");
          poVar3 = std::operator<<(poVar3,
                                   "std::equal(data.begin(), data.end(), Util::SpanCast<const uint8_t>(Util::MakeSpan(expectedValues)).begin(), Util::SpanCast<const uint8_t>(Util::MakeSpan(expectedValues)).end())"
                                  );
          poVar3 = std::operator<<(poVar3," was false, expected true.");
          std::endl<char,std::char_traits<char>>(poVar3);
          std::_Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>::~_Vector_base
                    ((_Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> *)&expectedValues)
          ;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x110);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"(data.Size()) == (size_t(8))");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x10b);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,
                               "std::equal(data.begin(), data.end(), Util::MakeSpan(expectedValues).begin(), Util::MakeSpan(expectedValues).end())"
                              );
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&expectedValues.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x108);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"(data.Size()) == (size_t(5))");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  uVar5 = 1;
LAB_0017a63c:
  MILBlob::Blob::StorageReader::~StorageReader(&reader);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&tempfile);
  return uVar5;
}

Assistant:

int testStorageReaderTestsRawData()
{
    auto tempfile = TestUtil::MakeStorageTempFileWith3Records();

    StorageReader reader(tempfile.GetFilename());

    {  // read uint8_t weights from metadata 1
        const auto data = reader.GetRawDataView(64);
        ML_ASSERT_EQ(data.Size(), size_t(5));

        std::vector<uint8_t> expectedValues = {0x02, 0x00, 0x40, 0x00, 0x07};
        ML_ASSERT_SPAN_EQ(data, Util::MakeSpan(expectedValues));
    }

    {  // read Fp16 weights from metadata 2
        auto data = reader.GetRawDataView(192);
        ML_ASSERT_EQ(data.Size(), size_t(8));

        std::vector<Fp16> expectedValues = {Fp16(0x000E), Fp16(0xC0FE), Fp16(0x0810), Fp16(0x0000)};
        ML_ASSERT_SPAN_EQ(data, Util::SpanCast<const uint8_t>(Util::MakeSpan(expectedValues)));
    }

    {  // read float weights from metadata 3
        auto data = reader.GetRawDataView(320);
        ML_ASSERT_EQ(data.Size(), size_t(16));

        std::vector<uint32_t> expectedValues = {0x700000, 0xC0FEE, 0x8FACE, 0x91FADE};
        ML_ASSERT_SPAN_EQ(data, Util::SpanCast<uint8_t>(Util::MakeSpan(expectedValues)));
    }

    return 0;
}